

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  CTSize CVar1;
  ulong uVar2;
  ushort uVar3;
  byte bVar4;
  IRRef1 IVar5;
  ushort uVar6;
  IRType IVar7;
  IRType IVar8;
  IRType IVar9;
  TRef TVar10;
  uint uVar11;
  TRef TVar12;
  cTValue *pcVar13;
  CType *pCVar14;
  GCcdata *pGVar15;
  ushort uVar16;
  ulong uVar17;
  IRRef1 IVar18;
  CType *ct;
  uint uVar19;
  IRRef1 IVar20;
  CTState *pCVar21;
  uint uVar22;
  bool bVar23;
  CTSize ofs;
  double *local_40;
  CTSize local_34;
  
  pCVar21 = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  uVar19 = sp >> 0x18 & 0x1f;
  if (uVar19 - 0xf < 5) {
    local_40 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
    uVar19 = 9;
LAB_00136038:
    ct = (CType *)((long)&pCVar21->tab->info + (ulong)(uVar19 << 4));
  }
  else {
    uVar11 = sp & 0x1f000000;
    if (uVar11 == 0xe000000) {
      local_40 = (double *)(ulong)((sval->u64 & 0x7fffffffffffffff) != 0);
      uVar19 = 0xe;
      goto LAB_00136038;
    }
    if (uVar19 - 1 < 2) {
      sp = lj_ir_kint(J,(uint)(uVar11 == 0x2000000));
      uVar19 = 3;
LAB_001367b4:
      local_40 = (double *)0x0;
      goto LAB_00136038;
    }
    IVar18 = (IRRef1)sp;
    if (uVar11 == 0xc000000) {
      if (*(char *)((ulong)(sval->u32).lo + 6) == '\x01') {
        (J->fold).ins.field_0.op1 = IVar18;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4310000a;
        TVar10 = lj_opt_fold(J);
        TVar12 = lj_ir_kint(J,1);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = IVar18;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4309000b;
      }
      else {
        TVar10 = lj_ir_kint64(J,0x18);
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = IVar18;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      }
      sp = lj_opt_fold(J);
      uVar19 = 0x11;
      goto LAB_001367b4;
    }
    if (uVar11 == 0x4000000) {
      if ((d->info & 0xf0000000) != 0x50000000) {
        if ((d->info & 0xfc000000) == 0x30000000) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        TVar10 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = IVar18;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
        sp = lj_opt_fold(J);
        uVar19 = 0x14;
        goto LAB_001367b4;
      }
      uVar19 = (sval->u32).lo;
      local_40 = (double *)0x0;
      pCVar14 = lj_ctype_getfieldq(pCVar21,d,&((GCobj *)(ulong)uVar19)->str,&local_34,(CTInfo *)0x0)
      ;
      TVar10 = lj_ir_kgc(J,(GCobj *)(ulong)uVar19,IRT_STR);
      (J->fold).ins.field_0.ot = 0x884;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      lj_opt_fold(J);
      uVar19 = 0x11;
      if (pCVar14 != (CType *)0x0) {
        if ((pCVar14->info & 0xf0000000) == 0xb0000000) {
          local_40 = (double *)(ulong)(local_34 != 0);
          sp = lj_ir_kint(J,local_34);
          uVar19 = (uint)(ushort)pCVar14->info;
        }
        else {
          local_40 = (double *)0x0;
        }
      }
      goto LAB_00136038;
    }
    if (uVar11 == 0) {
      local_40 = (double *)0x0;
      sp = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      uVar19 = 0x11;
      goto LAB_00136038;
    }
    pGVar15 = argv2cdata(J,sp,sval);
    pCVar14 = pCVar21->tab;
    uVar19 = pCVar14[pGVar15->ctypeid].info;
    ct = pCVar14 + pGVar15->ctypeid;
    local_40 = (double *)((ulong)(sval->u32).lo + 8);
    IVar8 = crec_ct2irt(pCVar21,ct);
    uVar11 = uVar19 >> 0x1c;
    uVar3 = (ushort)IVar8;
    if (uVar11 == 2) {
      (J->fold).ins.field_0.ot = uVar3 | 0x4300;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = 0xd;
      sp = lj_opt_fold(J);
      if ((ct->info & 0xf0800000) == 0x20800000) {
        local_40 = (double *)*local_40;
        uVar2 = (ulong)(ushort)ct->info;
        uVar17 = uVar2 * 0x10;
        uVar19 = pCVar21->tab[uVar2].info;
        if ((uVar19 & 0xf0000000) == 0x50000000) {
          uVar17 = (ulong)((uVar19 & 0xffff) << 4);
        }
        ct = (CType *)((long)&pCVar21->tab->info + uVar17);
        IVar8 = crec_ct2irt(pCVar21,ct);
LAB_00136b93:
        if ((ct->info < 0x10000000) && (IVar8 != IRT_CDATA)) {
          (J->fold).ins.field_0.ot = (ushort)IVar8 | 0x4400;
          (J->fold).ins.field_0.op1 = (IRRef1)sp;
          (J->fold).ins.field_0.op2 = 0;
          goto LAB_00136bc8;
        }
      }
    }
    else {
      if (IVar8 - IRT_I64 < 2) {
        (J->fold).ins.field_0.ot = uVar3 | 0x4300;
        (J->fold).ins.field_0.op1 = IVar18;
        (J->fold).ins.field_0.op2 = 0xf;
      }
      else {
        if (1 < IVar8 - IRT_INT) {
          TVar10 = lj_ir_kint64(J,8);
          (J->fold).ins.field_0.ot = 0x2809;
          (J->fold).ins.field_0.op1 = IVar18;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          sp = lj_opt_fold(J);
          goto LAB_00136b93;
        }
        if (uVar11 == 5) {
          ct = (CType *)((long)&pCVar14->info + (ulong)((uVar19 & 0xffff) << 4));
        }
        (J->fold).ins.field_0.ot = uVar3 | 0x4300;
        (J->fold).ins.field_0.op1 = IVar18;
        (J->fold).ins.field_0.op2 = 0xe;
      }
LAB_00136bc8:
      sp = lj_opt_fold(J);
    }
  }
  if ((d->info & 0xf0000000) == 0x50000000) {
    d = (CType *)((long)&pCVar21->tab->info + (ulong)((d->info & 0xffff) << 4));
  }
  pCVar21 = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  IVar7 = crec_ct2irt(pCVar21,d);
  IVar8 = crec_ct2irt(pCVar21,ct);
  if ((0x3fffffff < d->info) || (uVar19 = ct->info, 0x3fffffff < uVar19))
  goto switchD_001360f3_caseD_3;
  uVar11 = d->size;
  bVar4 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar19 >> 0x18) & 0x3c)) & 0xf) +
          ((byte)(0xf436fff5fff7f021 >> ((byte)(d->info >> 0x18) & 0x3c)) & 0xf) * '\b';
  if (0x36 < bVar4) {
    if (bVar4 != 0x3f) goto switchD_001360f3_caseD_3;
switchD_001360f3_caseD_36:
    if (dp == 0) goto switchD_001360f3_caseD_3;
    TVar10 = lj_ir_kint(J,uVar11);
    crec_copy(J,dp,sp,TVar10,d);
    goto LAB_00136655;
  }
  uVar22 = ct->size;
  IVar20 = (IRRef1)sp;
  uVar16 = (ushort)IVar8;
  IVar18 = (IRRef1)dp;
  uVar3 = (ushort)IVar7;
  switch(bVar4) {
  case 0:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 1:
  case 2:
    if (IVar8 == IRT_CDATA) goto switchD_001360f3_caseD_3;
    if (IVar8 - IRT_FLOAT < 2) {
      pcVar13 = lj_ir_k64_find(J,0);
      TVar10 = lj_ir_k64(J,IR_KNUM,pcVar13);
      IVar5 = (IRRef1)TVar10;
    }
    else if (IVar8 - IRT_I64 < 2) {
      pcVar13 = lj_ir_k64_find(J,0);
      TVar10 = lj_ir_k64(J,IR_KINT64,pcVar13);
      IVar5 = (IRRef1)TVar10;
    }
    else {
      TVar10 = lj_ir_kint(J,0);
      IVar5 = (IRRef1)TVar10;
    }
    if (local_40 == (double *)0x0) {
      bVar23 = false;
    }
    else if (local_40 == (double *)0x1) {
      bVar23 = true;
    }
    else {
      CVar1 = ct->size;
      if ((ct->info & 0x4000000) == 0) {
        if (CVar1 == 4) {
          bVar23 = *(float *)local_40 == 0.0;
        }
        else if (CVar1 == 2) {
          bVar23 = *(short *)local_40 == 0;
        }
        else if (CVar1 == 1) {
          bVar23 = *(char *)local_40 == '\0';
        }
        else {
          bVar23 = *local_40 == 0.0;
        }
        bVar23 = !bVar23;
      }
      else {
        if (CVar1 == 4) {
          bVar23 = *(float *)local_40 != 0.0;
        }
        else {
          bVar23 = *local_40 != 0.0;
        }
        bVar23 = (bool)(-bVar23 & 1);
      }
    }
    (J->fold).ins.field_0.ot = (ushort)bVar23 << 8 | uVar16 | 0x880;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    sp = lj_ir_kint(J,(uint)bVar23);
    break;
  default:
    goto switchD_001360f3_caseD_3;
  case 8:
  case 9:
switchD_001360f3_caseD_8:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001360f3_caseD_3;
    if ((uVar11 == 8) && ((uVar22 < 8 && ((uVar19 & 0x800000) == 0)))) {
      uVar6 = uVar3 | 0x5500;
      if (uVar22 < 4) {
        IVar8 = IRT_INT;
      }
      uVar16 = (ushort)(IVar7 << 5) | (ushort)IVar8 | 0x800;
      goto LAB_00136589;
    }
    if ((7 < uVar11) || (uVar22 != 8)) {
      if (IVar8 == IRT_INT) {
        sp = lj_opt_narrow_toint(J,sp);
      }
      break;
    }
    IVar9 = IRT_INT;
    if (3 < uVar11) {
      IVar9 = IVar7;
    }
    uVar16 = (ushort)IVar8 | (ushort)(IVar9 << 5);
    (J->fold).ins.field_0.ot = (ushort)IVar9 | 0x5500;
    goto LAB_0013660c;
  case 0xb:
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
  case 10:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) {
switchD_001360f3_caseD_3:
      lj_trace_err(J,LJ_TRERR_NYICONV);
    }
    IVar8 = IRT_INT;
    if (3 < uVar11) {
      IVar8 = IVar7;
    }
    uVar6 = (ushort)IVar8;
    uVar16 = (ushort)(IVar8 << 5) | uVar16 | 0x1400;
LAB_00136545:
    (J->fold).ins.field_0.ot = uVar6 | 0x5500;
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar16;
LAB_0013661b:
    sp = lj_opt_fold(J);
    break;
  case 0xd:
  case 0xe:
    if ((uVar11 & 8) == 0) {
      IVar8 = IRT_U64;
      uVar19 = 0x800000;
      uVar22 = 8;
      goto switchD_001360f3_caseD_8;
    }
    IVar8 = IRT_INT;
    if (3 < uVar11) {
      IVar8 = IVar7;
    }
    uVar6 = (ushort)IVar8;
    uVar16 = (ushort)(IVar8 << 5) | 9;
    goto LAB_00136545;
  case 0x10:
  case 0x11:
    goto switchD_001360f3_caseD_10;
  case 0x12:
    goto switchD_001360f3_caseD_12;
  case 0x13:
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_001360f3_caseD_12:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001360f3_caseD_3;
    if (IVar7 == IVar8) break;
    uVar16 = uVar16 | (ushort)(IVar7 << 5);
    (J->fold).ins.field_0.ot = uVar3 | 0x5500;
LAB_0013660c:
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar16;
    goto LAB_0013661b;
  case 0x19:
  case 0x1a:
    pcVar13 = lj_ir_k64_find(J,(ulong)(uVar11 >> 1));
    TVar10 = lj_ir_k64(J,IR_KINT64,pcVar13);
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar10 = lj_opt_fold(J);
    pcVar13 = lj_ir_k64_find(J,0);
    TVar12 = lj_ir_k64(J,IR_KNUM,pcVar13);
    (J->fold).ins.field_0.ot = uVar3 | 0x4b00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    lj_opt_fold(J);
    if ((uVar19 >> 0x1a & 1) != 0) goto switchD_001360f3_caseD_12;
switchD_001360f3_caseD_10:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001360f3_caseD_3;
    uVar6 = uVar3 | 0x5500;
    if (uVar22 < 4) {
      IVar8 = IRT_INT;
    }
    uVar16 = (ushort)(IVar7 << 5) | (ushort)IVar8;
LAB_00136589:
    (J->fold).ins.field_0.ot = uVar6;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = uVar16;
    goto LAB_0013661b;
  case 0x1b:
    if ((IVar7 == IRT_CDATA) || (IVar8 == IRT_CDATA)) goto switchD_001360f3_caseD_3;
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = 0;
    TVar10 = lj_opt_fold(J);
    IVar5 = (IRRef1)TVar10;
    pcVar13 = lj_ir_k64_find(J,(ulong)(uVar22 >> 1));
    TVar10 = lj_ir_k64(J,IR_KINT64,pcVar13);
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar20;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar10 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar16 | 0x4400;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = 0;
    TVar10 = lj_opt_fold(J);
    IVar20 = (IRRef1)TVar10;
    if (IVar7 != IVar8) {
      uVar16 = uVar16 | (ushort)(IVar7 << 5);
      (J->fold).ins.field_0.ot = uVar3 | 0x5500;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = uVar16;
      TVar10 = lj_opt_fold(J);
      IVar5 = (IRRef1)TVar10;
      (J->fold).ins.field_0.ot = uVar3 | 0x5500;
      (J->fold).ins.field_0.op1 = IVar20;
      (J->fold).ins.field_0.op2 = uVar16;
      TVar10 = lj_opt_fold(J);
      IVar20 = (IRRef1)TVar10;
    }
    (J->fold).ins.field_0.ot = uVar3 | 0x4b00;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = IVar5;
    lj_opt_fold(J);
    pcVar13 = lj_ir_k64_find(J,(ulong)(uVar11 >> 1));
    TVar10 = lj_ir_k64(J,IR_KINT64,pcVar13);
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar10 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar3 | 0x4b00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = IVar20;
    goto LAB_00136650;
  case 0x29:
    if (IVar8 == IRT_CDATA) goto switchD_001360f3_caseD_3;
    break;
  case 0x2a:
    if (IVar8 == IRT_CDATA) goto switchD_001360f3_caseD_3;
    uVar6 = uVar11 == 8 | 0x5514;
    uVar16 = (ushort)(uVar11 == 8) << 5 | uVar16 | 0x1680;
    goto LAB_00136589;
  case 0x36:
    goto switchD_001360f3_caseD_36;
  }
  if (dp != 0) {
    (J->fold).ins.field_0.ot = uVar3 | 0x4b00;
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = (IRRef1)sp;
LAB_00136650:
    lj_opt_fold(J);
LAB_00136655:
    sp = 0;
  }
  return sp;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lua_assert(ctype_child(cts, cct)->size == 4);
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else {  /* NYI: tref_istab(sp), tref_islightud(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    t = crec_ct2irt(cts, s);
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}